

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_iso_time(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
              *this)

{
  char local_9;
  
  on_24_hour_time(this);
  local_9 = ':';
  basic_buffer<char>::push_back(&((this->out).container)->super_basic_buffer<char>,&local_9);
  write(this,(int)((this->s).__r % 0x3c),(void *)0x2,0x3c);
  return;
}

Assistant:

void on_iso_time() {
    on_24_hour_time();
    *out++ = ':';
    write(second(), 2);
  }